

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_ObjSlack(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int LevelSum;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjLevelD(p,iObj);
  iVar2 = Acb_ObjLevelR(p,iObj);
  iVar3 = Acb_ObjIsCio(p,iObj);
  if (iVar1 + iVar2 <= (int)((uint)((iVar3 != 0 ^ 0xffU) & 1) + p->LevelMax)) {
    iVar3 = Acb_ObjIsCio(p,iObj);
    return ((uint)((iVar3 != 0 ^ 0xffU) & 1) + p->LevelMax) - (iVar1 + iVar2);
  }
  __assert_fail("!Acb_ObjIsCio(p, iObj) + p->LevelMax >= LevelSum",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                ,0xab,"int Acb_ObjSlack(Acb_Ntk_t *, int)");
}

Assistant:

int Acb_ObjSlack( Acb_Ntk_t * p, int iObj )
{
    int LevelSum = Acb_ObjLevelD(p, iObj) + Acb_ObjLevelR(p, iObj);
    assert( !Acb_ObjIsCio(p, iObj) + p->LevelMax >= LevelSum );
    return !Acb_ObjIsCio(p, iObj) + p->LevelMax - LevelSum;
}